

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O2

void Cmd_myinfo(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  PClass *pPVar5;
  
  bVar3 = CheckCheatmode(true);
  if ((!bVar3) && ((DObject *)(&players)[(long)consoleplayer * 0x54] != (DObject *)0x0)) {
    pPVar5 = DObject::GetClass((DObject *)(&players)[(long)consoleplayer * 0x54]);
    pcVar2 = FName::NameData.NameArray
             [(pPVar5->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index].Text;
    uVar1 = ((AActor *)(&players)[(long)consoleplayer * 0x54])->health;
    uVar4 = AActor::SpawnHealth((AActor *)(&players)[(long)consoleplayer * 0x54]);
    Printf("Target=%s, Health=%d, Spawnhealth=%d\n",pcVar2,(ulong)uVar1,(ulong)uVar4);
    PrintMiscActorInfo((AActor *)(&players)[(long)consoleplayer * 0x54]);
    return;
  }
  return;
}

Assistant:

CCMD(myinfo)
{
	if (CheckCheatmode () || players[consoleplayer].mo == NULL) return;
	Printf("Target=%s, Health=%d, Spawnhealth=%d\n",
		players[consoleplayer].mo->GetClass()->TypeName.GetChars(),
		players[consoleplayer].mo->health,
		players[consoleplayer].mo->SpawnHealth());
	PrintMiscActorInfo(players[consoleplayer].mo);
}